

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd_huffman.c
# Opt level: O2

size_t nghttp2_hd_huff_encode_count(uint8_t *src,size_t len)

{
  long lVar1;
  size_t sVar2;
  
  lVar1 = 0;
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    lVar1 = lVar1 + (ulong)huff_sym_table[src[sVar2]].nbits;
  }
  return lVar1 + 7U >> 3;
}

Assistant:

size_t nghttp2_hd_huff_encode_count(const uint8_t *src, size_t len) {
  size_t i;
  size_t nbits = 0;

  for (i = 0; i < len; ++i) {
    nbits += huff_sym_table[src[i]].nbits;
  }
  /* pad the prefix of EOS (256) */
  return (nbits + 7) / 8;
}